

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn64.c
# Opt level: O1

uc_err reg_read_sparc64(void *_env,int mode,uint regid,void *value,size_t *size)

{
  CPUSPARCState_conflict1 *env;
  undefined8 *puVar1;
  
  if (regid - 0x35 < 8) {
    if (7 < *size) {
      *size = 8;
      puVar1 = (undefined8 *)((long)_env + (ulong)(regid - 0x35) * 8);
      goto LAB_004bb1e4;
    }
  }
  else if (regid - 0x4e < 8) {
    if (7 < *size) {
      *size = 8;
      puVar1 = (undefined8 *)(*(long *)((long)_env + 0x40) + (ulong)regid * 8 + -0x270);
      goto LAB_004bb1e4;
    }
  }
  else if (regid - 0x46 < 8) {
    if (7 < *size) {
      *size = 8;
      puVar1 = (undefined8 *)(*(long *)((long)_env + 0x40) + (ulong)regid * 8 + -0x1f0);
      goto LAB_004bb1e4;
    }
  }
  else if (regid - 0x3d < 8) {
    if (7 < *size) {
      *size = 8;
      puVar1 = (undefined8 *)(*(long *)((long)_env + 0x40) + (ulong)regid * 8 + -0x168);
LAB_004bb1e4:
      *(undefined8 *)value = *puVar1;
      return UC_ERR_OK;
    }
  }
  else {
    if (regid != 0x58) {
      return UC_ERR_ARG;
    }
    if (7 < *size) {
      *size = 8;
      puVar1 = (undefined8 *)((long)_env + 0x48);
      goto LAB_004bb1e4;
    }
  }
  return UC_ERR_OVERFLOW;
}

Assistant:

DEFAULT_VISIBILITY
uc_err reg_read(void *_env, int mode, unsigned int regid, void *value,
                       size_t *size)
{
    CPUSPARCState *env = _env;
    uc_err ret = UC_ERR_ARG;

    if (regid >= UC_SPARC_REG_G0 && regid <= UC_SPARC_REG_G7) {
        CHECK_REG_TYPE(uint64_t);
        *(uint64_t *)value = env->gregs[regid - UC_SPARC_REG_G0];
    } else if (regid >= UC_SPARC_REG_O0 && regid <= UC_SPARC_REG_O7) {
        CHECK_REG_TYPE(uint64_t);
        *(uint64_t *)value = env->regwptr[regid - UC_SPARC_REG_O0];
    } else if (regid >= UC_SPARC_REG_L0 && regid <= UC_SPARC_REG_L7) {
        CHECK_REG_TYPE(uint64_t);
        *(uint64_t *)value = env->regwptr[8 + regid - UC_SPARC_REG_L0];
    } else if (regid >= UC_SPARC_REG_I0 && regid <= UC_SPARC_REG_I7) {
        CHECK_REG_TYPE(uint64_t);
        *(uint64_t *)value = env->regwptr[16 + regid - UC_SPARC_REG_I0];
    } else {
        switch(regid) {
        default:
            break;
        case UC_SPARC_REG_PC:
            CHECK_REG_TYPE(uint64_t);
            *(uint64_t *)value = env->pc;
            break;
        }
    }

    return ret;
}